

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

int main(void)

{
  nn_list_item *pnVar1;
  char *pcVar2;
  nn_list *self;
  nn_list *self_00;
  nn_list *self_01;
  undefined8 uStack_30;
  nn_list local_28;
  
  self = &local_28;
  self_00 = &local_28;
  self_01 = &local_28;
  that.item.prev._0_4_ = 0xffffffff;
  that.item.next = (nn_list_item *)0xffffffffffffffff;
  that.item.prev._4_4_ = 0xffffffff;
  nn_list_item_term(&that.item);
  local_28.first = (nn_list_item *)0x0;
  local_28.last = (nn_list_item *)0x0;
  nn_list_term(&local_28);
  local_28.first = (nn_list_item *)0x0;
  local_28.last = (nn_list_item *)0x0;
  nn_list_term(&local_28);
  local_28.first = (nn_list_item *)0x0;
  local_28.last = (nn_list_item *)0x0;
  that.item.prev._0_4_ = 0xffffffff;
  that.item.next = (nn_list_item *)0xffffffffffffffff;
  that.item.prev._4_4_ = 0xffffffff;
  nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
  if (that.item.prev == (nn_list_item *)0x0) {
    if (that.item.next == (nn_list_item *)0x0) {
      if (local_28.first == &that.item) {
        if (local_28.last == &that.item) {
          nn_list_erase(&local_28,&that.item);
          if (that.item.prev == (nn_list_item *)0xffffffffffffffff) {
            if (local_28.first == (nn_list_item *)0x0) {
              if (local_28.last == (nn_list_item *)0x0) {
                nn_list_item_term(&that.item);
                nn_list_term(&local_28);
                local_28.first = (nn_list_item *)0x0;
                local_28.last = (nn_list_item *)0x0;
                that.item.prev._0_4_ = 0xffffffff;
                that.item.next = (nn_list_item *)0xffffffffffffffff;
                that.item.prev._4_4_ = 0xffffffff;
                nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
                if (local_28.first == &that.item) {
                  pnVar1 = nn_list_prev(&local_28,&that.item);
                  if (pnVar1 == (nn_list_item *)0x0) {
                    pnVar1 = nn_list_next(self,&that.item);
                    if (pnVar1 == (nn_list_item *)0x0) {
                      nn_list_erase(&local_28,&that.item);
                      nn_list_item_term(&that.item);
                      nn_list_term(&local_28);
                      local_28.first = (nn_list_item *)0x0;
                      local_28.last = (nn_list_item *)0x0;
                      that.item.prev._0_4_ = 0xffffffff;
                      that.item.next = (nn_list_item *)0xffffffffffffffff;
                      that.item.prev._4_4_ = 0xffffffff;
                      other.item = that.item;
                      nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
                      nn_list_insert(&local_28,&other.item,(nn_list_item *)0x0);
                      if (local_28.first == &that.item) {
                        pnVar1 = nn_list_next(self_00,&that.item);
                        if (pnVar1 == &other.item) {
                          nn_list_erase(&local_28,&that.item);
                          nn_list_erase(&local_28,&other.item);
                          nn_list_item_term(&that.item);
                          nn_list_item_term(&other.item);
                          nn_list_term(&local_28);
                          local_28.first = (nn_list_item *)0x0;
                          local_28.last = (nn_list_item *)0x0;
                          that.item.prev._0_4_ = 0xffffffff;
                          that.item.next = (nn_list_item *)0xffffffffffffffff;
                          that.item.prev._4_4_ = 0xffffffff;
                          other.item = that.item;
                          nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
                          nn_list_insert(&local_28,&other.item,local_28.first);
                          if (local_28.first == &other.item) {
                            pnVar1 = nn_list_next(self_01,&other.item);
                            if (pnVar1 == &that.item) {
                              nn_list_erase(&local_28,&that.item);
                              nn_list_erase(&local_28,&other.item);
                              nn_list_item_term(&that.item);
                              nn_list_item_term(&other.item);
                              nn_list_term(&local_28);
                              return 0;
                            }
                            pcVar2 = "list_item == &that.item";
                            uStack_30 = 0xbb;
                          }
                          else {
                            pcVar2 = "list_item == &other.item";
                            uStack_30 = 0xb8;
                          }
                        }
                        else {
                          pcVar2 = "list_item == &other.item";
                          uStack_30 = 0xa6;
                        }
                      }
                      else {
                        pcVar2 = "list_item == &that.item";
                        uStack_30 = 0xa3;
                      }
                    }
                    else {
                      pcVar2 = "list_item == NULL";
                      uStack_30 = 0x90;
                    }
                  }
                  else {
                    pcVar2 = "list_item == NULL";
                    uStack_30 = 0x8d;
                  }
                }
                else {
                  pcVar2 = "list_item == &that.item";
                  uStack_30 = 0x84;
                }
              }
              else {
                pcVar2 = "list.last == NULL";
                uStack_30 = 0x77;
              }
            }
            else {
              pcVar2 = "list.first == NULL";
              uStack_30 = 0x76;
            }
          }
          else {
            pcVar2 = "!nn_list_item_isinlist (&that.item)";
            uStack_30 = 0x74;
          }
        }
        else {
          pcVar2 = "list.last == &that.item";
          uStack_30 = 0x70;
        }
      }
      else {
        pcVar2 = "list.first == &that.item";
        uStack_30 = 0x6f;
      }
    }
    else {
      pcVar2 = "that.item.next == NULL";
      uStack_30 = 0x6c;
    }
  }
  else if (that.item.prev == (nn_list_item *)0xffffffffffffffff) {
    pcVar2 = "nn_list_item_isinlist (&that.item)";
    uStack_30 = 0x68;
  }
  else {
    pcVar2 = "that.item.prev == NULL";
    uStack_30 = 0x6b;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/list.c",
          uStack_30);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    struct nn_list list;
    struct nn_list_item *list_item;
    struct item *item;

    /*  List item life cycle. */

    /*  Initialize the item. Make sure it's not part of any list. */
    nn_list_item_init (&that.item);
    nn_assert (!nn_list_item_isinlist (&that.item));

    /*  That may be part of some list, or uninitialized memory. */
    that.item.prev = &sentinel;
    that.item.next = &sentinel;
    nn_assert (nn_list_item_isinlist (&that.item));
    that.item.prev = NULL;
    that.item.next = NULL;
    nn_assert (nn_list_item_isinlist (&that.item));

    /*  Before termination, item must be removed from the list. */
    nn_list_item_init (&that.item);
    nn_list_item_term (&that.item);

    /*  Initializing a list. */

    /*  Uninitialized list has random content. */
    list.first = &sentinel;
    list.last = &sentinel;

    nn_list_init (&list);

    nn_assert (list.first == NULL);
    nn_assert (list.last == NULL);

    nn_list_term (&list);
    
    /*  Empty list. */
    
    nn_list_init (&list);

    rc = nn_list_empty (&list);
    nn_assert (rc == 1); 

    list_item = nn_list_begin (&list);
    nn_assert (list_item == NULL);

    list_item = nn_list_end (&list);
    nn_assert (list_item == NULL);

    nn_list_term (&list);

    /*  Inserting and erasing items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);

    /*  Item doesn'tt belong to list yet. */
    nn_assert (!nn_list_item_isinlist (&that.item));

    nn_list_insert (&list, &that.item, nn_list_end (&list));

    /*  Item is now part of a list. */
    nn_assert (nn_list_item_isinlist (&that.item));

    /*  Single item does not have prev or next item. */
    nn_assert (that.item.prev == NULL);
    nn_assert (that.item.next == NULL);

    /*  Item is both first and list item. */
    nn_assert (list.first == &that.item);
    nn_assert (list.last == &that.item);

    /*  Removing an item. */
    nn_list_erase (&list, &that.item);
    nn_assert (!nn_list_item_isinlist (&that.item));

    nn_assert (list.first == NULL);
    nn_assert (list.last == NULL);

    nn_list_item_term (&that.item);
    nn_list_term (&list);

    /*  Iterating items. */
    
    nn_list_init (&list);
    nn_list_item_init (&that.item);

    nn_list_insert (&list, &that.item, nn_list_end (&list));
    
    list_item = nn_list_begin (&list);
    nn_assert (list_item == &that.item);

    item = nn_cont (list_item, struct item, item);
    nn_assert (item == &that);

    list_item = nn_list_end (&list);
    nn_assert (list_item == NULL);

    list_item = nn_list_prev (&list, &that.item);
    nn_assert (list_item == NULL);

    list_item = nn_list_next (&list, &that.item);
    nn_assert (list_item == NULL);

    rc = nn_list_empty (&list);
    nn_assert (rc == 0);

    nn_list_erase (&list, &that.item);
    nn_list_item_term (&that.item);
    nn_list_term (&list);

    /*  Appending items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);
    nn_list_item_init (&other.item);

    nn_list_insert (&list, &that.item, nn_list_end (&list));
    nn_list_insert (&list, &other.item, nn_list_end (&list));

    list_item = nn_list_begin (&list);
    nn_assert (list_item == &that.item);

    list_item = nn_list_next (&list, list_item);
    nn_assert (list_item == &other.item);

    nn_list_erase (&list, &that.item);
    nn_list_erase (&list, &other.item);
    nn_list_item_term (&that.item);
    nn_list_item_term (&other.item);
    nn_list_term (&list);

    /*  Prepending items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);
    nn_list_item_init (&other.item);

    nn_list_insert (&list, &that.item, nn_list_begin (&list));
    nn_list_insert (&list, &other.item, nn_list_begin (&list));

    list_item = nn_list_begin (&list);
    nn_assert (list_item == &other.item);

    list_item = nn_list_next (&list, list_item);
    nn_assert (list_item == &that.item);

    nn_list_erase (&list, &that.item);
    nn_list_erase (&list, &other.item);
    nn_list_item_term (&that.item);
    nn_list_item_term (&other.item);
    nn_list_term (&list);

    return 0;
}